

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

JavascriptString * Js::JavascriptNumber::ToLocaleString(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  charcount_t cVar4;
  Var aValue;
  JavascriptString *pJVar5;
  undefined4 extraout_var;
  size_t count;
  Memory *this;
  WCHAR *buffer;
  undefined4 *puVar6;
  char16_t *obj;
  WCHAR local_a68 [4];
  WCHAR szRes [1280];
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._32_8_ = value;
  bVar2 = NumberUtilities::IsFinite(value);
  if (!bVar2) {
    pJVar5 = ToLocaleStringNanOrInfinite((double)data._32_8_,scriptContext);
    return pJVar5;
  }
  aValue = FormatDoubleToString((double)data._32_8_,FormatFixed,-1,scriptContext);
  pJVar5 = VarTo<Js::JavascriptString>(aValue);
  iVar3 = (*(pJVar5->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar5);
  cVar4 = JavascriptString::GetLength(pJVar5);
  buffer = local_a68;
  data._32_8_ = (WCHAR *)CONCAT44(extraout_var,iVar3);
  count = PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                    ((WCHAR *)CONCAT44(extraout_var,iVar3),(ulong)cVar4,buffer,0x500);
  if (count != 0) {
    if (count < 0x501) {
      obj = (char16_t *)0x0;
    }
    else {
      local_60 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_781dc16;
      data.filename._0_4_ = 0x458;
      data.plusSize = count;
      this = (Memory *)
             Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
      buffer = Memory::AllocateArray<Memory::HeapAllocator,char16_t,false>
                         (this,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,count);
      count = PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                        ((WCHAR *)data._32_8_,(ulong)cVar4,buffer,count);
      obj = buffer;
      if (count == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                    ,0x45e,"(false)","GetNumberFormatEx failed");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
        JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
      }
    }
    pJVar5 = JavascriptString::NewCopySz(buffer,scriptContext);
    if (obj != (char16_t *)0x0) {
      Memory::DeleteArray<Memory::HeapAllocator,char16_t>
                (&Memory::HeapAllocator::Instance,count,obj);
    }
  }
  return pJVar5;
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleString(double value, ScriptContext* scriptContext)
    {
        WCHAR   szRes[bufSize];
        WCHAR * pszRes = NULL;
        WCHAR * pszToBeFreed = NULL;
        size_t  count;

        if (!Js::NumberUtilities::IsFinite(value))
        {
            //
            // +- Infinity : use the localized string
            // NaN would be returned as NaN
            //
            return ToLocaleStringNanOrInfinite(value, scriptContext);
        }

        JavascriptString *result = nullptr;

        JavascriptString *dblStr = VarTo<JavascriptString>(FormatDoubleToString(value, NumberUtilities::FormatFixed, -1, scriptContext));
        const char16* szValue = dblStr->GetSz();
        const size_t szLength = dblStr->GetLength();

        pszRes = szRes;
        count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, bufSize);

        if( count == 0 )
        {
            return dblStr;
        }
        else
        {
            if( count > bufSize )
            {
                pszRes = pszToBeFreed = HeapNewArray(char16, count);

                count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, count);

                if ( count == 0 )
                {
                     AssertMsg(false, "GetNumberFormatEx failed");
                     JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
                }
            }

            if ( count != 0 )
            {
                result = JavascriptString::NewCopySz(pszRes, scriptContext);
            }
        }

        if ( pszToBeFreed )
        {
            HeapDeleteArray(count, pszToBeFreed);
        }

        return result;
    }